

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

iterator __thiscall
gtl::internal_btree::
btree<gtl::internal_btree::map_params<S2CellId,S2ShapeIndexCell*,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2ShapeIndexCell*>>,256,false>>
::insert_hint_unique<std::pair<S2CellId_const,S2ShapeIndexCell*>>
          (btree<gtl::internal_btree::map_params<S2CellId,S2ShapeIndexCell*,std::less<S2CellId>,std::allocator<std::pair<S2CellId_const,S2ShapeIndexCell*>>,256,false>>
           *this,iterator position,key_type *key,pair<const_S2CellId,_S2ShapeIndexCell_*> *args)

{
  node_type *pnVar1;
  int iVar2;
  btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
  *pbVar3;
  iterator iVar4;
  iterator iVar5;
  pair<gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>,_std::pair<const_S2CellId,_S2ShapeIndexCell_*>_&,_std::pair<const_S2CellId,_S2ShapeIndexCell_*>_*>,_bool>
  local_48;
  
  pbVar3 = position.node;
  if (*(long *)(this + 0x10) == 0) {
LAB_0019906e:
    insert_unique<std::pair<S2CellId_const,S2ShapeIndexCell*>>(&local_48,this,key,args);
    pbVar3 = local_48.first.node;
    iVar2 = local_48.first.position;
  }
  else {
    iVar2 = position.position;
    iVar4 = btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
            ::end((btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                   *)this);
    if (iVar4.node == pbVar3 && iVar4.position == iVar2) {
LAB_00198fbc:
      local_48.first.node = pbVar3;
      local_48.first.position = iVar2;
      pnVar1 = btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
               ::leftmost((btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                           *)this);
      if (pnVar1 != pbVar3 || iVar2 != 0) {
        btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>,_std::pair<const_S2CellId,_S2ShapeIndexCell_*>_&,_std::pair<const_S2CellId,_S2ShapeIndexCell_*>_*>
        ::decrement(&local_48.first);
        if (((ulong)local_48.first.node & 7) != 0) {
LAB_0019909e:
          __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/internal/layout.h"
                        ,0x1e1,
                        "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2CellId, S2ShapeIndexCell *>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2CellId, S2ShapeIndexCell *>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = const char]"
                       );
        }
        if (key->id_ <=
            *(ulong *)(local_48.first.node + (long)local_48.first.position * 0x10 + 0x10))
        goto LAB_0019906e;
      }
    }
    else {
      if (((undefined1  [16])position & (undefined1  [16])0x7) != (undefined1  [16])0x0)
      goto LAB_0019909e;
      if (key->id_ < *(ulong *)(pbVar3 + (long)iVar2 * 0x10 + 0x10)) goto LAB_00198fbc;
      if (key->id_ <= *(ulong *)(pbVar3 + (long)iVar2 * 0x10 + 0x10)) goto LAB_0019908a;
      local_48.first.node = pbVar3;
      local_48.first.position = iVar2;
      btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>,_std::pair<const_S2CellId,_S2ShapeIndexCell_*>_&,_std::pair<const_S2CellId,_S2ShapeIndexCell_*>_*>
      ::increment(&local_48.first);
      iVar4 = btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
              ::end((btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                     *)this);
      pbVar3 = local_48.first.node;
      iVar2 = local_48.first.position;
      if (local_48.first.node != iVar4.node || local_48.first.position != iVar4.position) {
        if (((ulong)local_48.first.node & 7) != 0) goto LAB_0019909e;
        if (*(ulong *)(local_48.first.node + (long)local_48.first.position * 0x10 + 0x10) <=
            key->id_) goto LAB_0019906e;
      }
    }
    iVar4.position = iVar2;
    iVar4.node = pbVar3;
    iVar4._12_4_ = 0;
    iVar4 = internal_emplace<std::pair<S2CellId_const,S2ShapeIndexCell*>>(this,iVar4,args);
    pbVar3 = iVar4.node;
    iVar2 = iVar4.position;
  }
LAB_0019908a:
  iVar5.position = iVar2;
  iVar5.node = pbVar3;
  iVar5._12_4_ = 0;
  return iVar5;
}

Assistant:

inline auto btree<P>::insert_hint_unique(iterator position, const key_type &key,
                                         Args &&... args) -> iterator {
  if (!empty()) {
    if (position == end() || compare_keys(key, position.key())) {
      iterator prev = position;
      if (position == begin() || compare_keys((--prev).key(), key)) {
        // prev.key() < key < position.key()
        return internal_emplace(position, std::forward<Args>(args)...);
      }
    } else if (compare_keys(position.key(), key)) {
      iterator next = position;
      ++next;
      if (next == end() || compare_keys(key, next.key())) {
        // position.key() < key < next.key()
        return internal_emplace(next, std::forward<Args>(args)...);
      }
    } else {
      // position.key() == key
      return position;
    }
  }
  return insert_unique(key, std::forward<Args>(args)...).first;
}